

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O2

int __thiscall QMakeProperty::setProperty(QMakeProperty *this,QStringList *optionProperties)

{
  QString var;
  char cVar1;
  int iVar2;
  QString *pQVar3;
  long lVar4;
  QString *pQVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (optionProperties->d).ptr;
  pQVar5 = pQVar3;
  do {
    lVar4 = (optionProperties->d).size;
    if (pQVar5 == pQVar3 + lVar4) {
      iVar2 = 0;
LAB_0010d681:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return iVar2;
      }
      __stack_chk_fail();
    }
    local_50.d = (pQVar5->d).d;
    local_50.ptr = (pQVar5->d).ptr;
    local_50.size = (pQVar5->d).size;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar3 = (optionProperties->d).ptr;
      lVar4 = (optionProperties->d).size;
    }
    if (pQVar5 + 1 == pQVar3 + lVar4) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      iVar2 = 0x65;
      goto LAB_0010d681;
    }
    QString::QString((QString *)&local_68,".");
    cVar1 = QString::startsWith((QString *)&local_50,(CaseSensitivity)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    if (cVar1 == '\0') {
      if (local_50.d != (Data *)0x0) {
        LOCK();
        ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      var.d.ptr = (char16_t *)local_50.d;
      var.d.d = (Data *)this;
      var.d.size = (qsizetype)local_50.ptr;
      setValue(this,var,(QString *)&stack0xffffffffffffff80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff80);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    pQVar5 = pQVar5 + 2;
    pQVar3 = (optionProperties->d).ptr;
  } while( true );
}

Assistant:

int QMakeProperty::setProperty(const QStringList &optionProperties)
{
    for (auto it = optionProperties.cbegin(); it != optionProperties.cend(); ++it) {
        QString var = (*it);
        ++it;
        if (it == optionProperties.cend()) {
            return PropFailRetCode;
        }
        if (!var.startsWith("."))
            setValue(var, (*it));
    }
    return PropSuccessRetCode;
}